

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_atomic_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  uint32_t result_id_00;
  SPIRType *pSVar1;
  runtime_error *prVar2;
  __node_gen_type __node_gen;
  char (*in_stack_ffffffffffffff60) [2];
  string local_98;
  uint32_t local_74;
  char *local_70;
  string local_68;
  string local_48;
  
  local_74 = result_id;
  local_70 = op;
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  if (*(int *)&(pSVar1->super_IVariant).field_0xc - 0xcU < 3) {
    if ((this->options).vulkan_semantics == false) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Floating point atomics requires Vulkan semantics.","");
      ::std::runtime_error::runtime_error(prVar2,(string *)&local_98);
      *(undefined ***)prVar2 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->options).es == true) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Floating point atomics requires desktop GLSL.","");
      ::std::runtime_error::runtime_error(prVar2,(string *)&local_98);
      *(undefined ***)prVar2 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"GL_EXT_shader_atomic_float","");
    require_extension_internal(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  local_98._M_dataplus._M_p = (pointer)&(this->super_Compiler).forced_temporaries;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_98._M_dataplus._M_p,&local_74);
  result_id_00 = local_74;
  to_non_uniform_aware_expression_abi_cxx11_(&local_48,this,op0);
  to_unpacked_expression_abi_cxx11_(&local_68,this,op1,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (&local_98,(spirv_cross *)&local_70,(char **)0x35c56f,(char (*) [2])&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c44c,
             (char (*) [3])&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,
             in_stack_ffffffffffffff60);
  emit_op(this,result_type,result_id_00,&local_98,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  Compiler::flush_all_atomic_capable_variables(&this->super_Compiler);
  return;
}

Assistant:

void CompilerGLSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op)
{
	auto &type = get<SPIRType>(result_type);
	if (type_is_floating_point(type))
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Floating point atomics requires Vulkan semantics.");
		if (options.es)
			SPIRV_CROSS_THROW("Floating point atomics requires desktop GLSL.");
		require_extension_internal("GL_EXT_shader_atomic_float");
	}

	forced_temporaries.insert(result_id);
	emit_op(result_type, result_id,
	        join(op, "(", to_non_uniform_aware_expression(op0), ", ",
	             to_unpacked_expression(op1), ")"), false);
	flush_all_atomic_capable_variables();
}